

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O1

void __thiscall ExeCommander::initCommands(ExeCommander *this)

{
  Command *pCVar1;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"info","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Exe Info","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153e88;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"r-v","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Convert: RAW -> RVA","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153e38;
  pCVar1[1]._vptr_Command = (_func_int **)0x200000001;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v-r","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Convert: RVA -> RAW","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153e38;
  pCVar1[1]._vptr_Command = (_func_int **)0x100000002;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"printc","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Print content by Raw address","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153f18;
  *(undefined4 *)&pCVar1[1]._vptr_Command = 1;
  *(undefined1 *)((long)&pCVar1[1]._vptr_Command + 4) = 0;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"printx","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Print content by Raw address - HEX","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153f18;
  *(undefined4 *)&pCVar1[1]._vptr_Command = 1;
  *(undefined1 *)((long)&pCVar1[1]._vptr_Command + 4) = 1;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cl","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Clear chosen wrapper Content","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1[1]._vptr_Command = (_func_int **)0xffffffffffffffff;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153f68;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fdump","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Dump chosen wrapper Content into a file","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1[1]._vptr_Command = (_func_int **)0xffffffffffffffff;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154050;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"winfo","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Dump chosen wrapper info","")
  ;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1[1]._vptr_Command = (_func_int **)0xffffffffffffffff;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_001540a8;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"einfo","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Dump wrapper entries","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1[1]._vptr_Command = (_func_int **)0xffffffffffffffff;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154100;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"e_add","");
  pCVar1 = (Command *)operator_new(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Add entry to a wrapper","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1[1]._vptr_Command = (_func_int **)0xffffffffffffffff;
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00154158;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"save","");
  pCVar1 = (Command *)operator_new(0x28);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Save exe to file","");
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_00153db8;
  (pCVar1->desc)._M_dataplus._M_p = (pointer)&(pCVar1->desc).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pCVar1->desc,local_50,local_48 + (long)local_50);
  pCVar1->_vptr_Command = (_func_int **)&PTR__Command_001541b0;
  Commander::addCommand(&this->super_Commander,&local_70,pCVar1,true);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ExeCommander::initCommands()
{
    this->addCommand("info", new ExeInfoCommand());

    this->addCommand("r-v", new ConvertAddrCommand(Executable::RAW, Executable::RVA, "Convert: RAW -> RVA"));
    this->addCommand("v-r", new ConvertAddrCommand(Executable::RVA, Executable::RAW, "Convert: RVA -> RAW"));

    this->addCommand("printc", new FetchCommand(false, Executable::RAW, "Print content by Raw address"));
    //this->addCommand("cV", new FetchCommand(false, Executable::RVA, "Fetch content by Virtual address"));

    this->addCommand("printx", new FetchCommand(true, Executable::RAW, "Print content by Raw address - HEX"));
    //this->addCommand("hV", new FetchCommand(true, Executable::RVA, "Fetch content by Virtual address - HEX"));

    this->addCommand("cl", new ClearWrapperCommand("Clear chosen wrapper Content"));
    this->addCommand("fdump", new DumpWrapperToFileCommand("Dump chosen wrapper Content into a file"));
    this->addCommand("winfo", new DumpWrapperCommand("Dump chosen wrapper info"));
    this->addCommand("einfo", new DumpWrapperEntriesCommand("Dump wrapper entries"));

    this->addCommand("e_add", new AddEntryCommand("Add entry to a wrapper"));
    this->addCommand("save", new SaveExeToFileCommand());
}